

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMsg * curl_multi_info_read(CURLM *multi_handle,int *msgs_in_queue)

{
  curl_llist_element *e;
  CURLMsg *pCVar1;
  int iVar2;
  size_t sVar3;
  
  *msgs_in_queue = 0;
  if (((multi_handle != (CURLM *)0x0) && (*multi_handle == 0xbab1e)) &&
     (sVar3 = Curl_llist_count(*(curl_llist **)((long)multi_handle + 0x20)), sVar3 != 0)) {
    e = (*(curl_llist **)((long)multi_handle + 0x20))->head;
    pCVar1 = (CURLMsg *)e->ptr;
    Curl_llist_remove(*(curl_llist **)((long)multi_handle + 0x20),e,(void *)0x0);
    sVar3 = Curl_llist_count(*(curl_llist **)((long)multi_handle + 0x20));
    iVar2 = curlx_uztosi(sVar3);
    *msgs_in_queue = iVar2;
    return pCVar1;
  }
  return (CURLMsg *)0x0;
}

Assistant:

CURLMsg *curl_multi_info_read(CURLM *multi_handle, int *msgs_in_queue)
{
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct Curl_message *msg;

  *msgs_in_queue = 0; /* default to none */

  if(GOOD_MULTI_HANDLE(multi) && Curl_llist_count(multi->msglist)) {
    /* there is one or more messages in the list */
    struct curl_llist_element *e;

    /* extract the head of the list to return */
    e = multi->msglist->head;

    msg = e->ptr;

    /* remove the extracted entry */
    Curl_llist_remove(multi->msglist, e, NULL);

    *msgs_in_queue = curlx_uztosi(Curl_llist_count(multi->msglist));

    return &msg->extmsg;
  }
  else
    return NULL;
}